

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckBlackList.cxx
# Opt level: O0

bool __thiscall kws::Parser::CheckBlackList(Parser *this,char *filename)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong uVar5;
  char *in_RSI;
  long in_RDI;
  Error error;
  size_t pos;
  string blackword;
  size_t end;
  size_t eol;
  size_t space;
  size_t start;
  char *buf;
  unsigned_long fileSize;
  ifstream file;
  bool hasError;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 uVar6;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffffcd0;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *in_stack_fffffffffffffcd8;
  size_t in_stack_fffffffffffffce0;
  Parser *in_stack_fffffffffffffce8;
  string local_2c0 [32];
  long local_2a0;
  string local_298 [32];
  ulong local_278;
  ulong local_270;
  ulong local_268;
  ulong local_260;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *local_258;
  undefined1 local_250 [16];
  size_t local_240;
  int local_238;
  char local_228 [527];
  byte local_19;
  char *local_18;
  byte local_1;
  
  *(undefined1 *)(in_RDI + 0x48) = 1;
  local_18 = in_RSI;
  std::__cxx11::string::operator=
            ((string *)(in_RDI + 0x358),"No word should match any words from the file: ");
  std::__cxx11::string::operator+=((string *)(in_RDI + 0x358),local_18);
  local_19 = 0;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = strcmp(pcVar3,local_18);
  if (iVar2 != 0) {
    std::ifstream::ifstream(local_228);
    pcVar3 = local_18;
    std::operator|(_S_bin,_S_in);
    std::ifstream::open(local_228,(_Ios_Openmode)pcVar3);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Cannot open file: ");
      poVar4 = std::operator<<(poVar4,local_18);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
      local_238 = 1;
    }
    else {
      std::istream::seekg((long)local_228,_S_beg);
      local_250 = std::istream::tellg();
      in_stack_fffffffffffffce8 = local_250._8_8_;
      in_stack_fffffffffffffce0 = std::fpos::operator_cast_to_long((fpos *)local_250);
      local_240 = in_stack_fffffffffffffce0;
      std::istream::seekg((long)local_228,_S_beg);
      in_stack_fffffffffffffcd8 =
           (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
           operator_new__(local_240 + 1);
      local_258 = in_stack_fffffffffffffcd8;
      std::istream::read(local_228,(long)in_stack_fffffffffffffcd8);
      *(undefined1 *)
       ((long)&(local_258->super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>).
               _M_impl.super__Vector_impl_data._M_start + local_240) = 0;
      std::__cxx11::string::operator=((string *)(in_RDI + 0x680),(char *)local_258);
      std::__cxx11::string::resize(in_RDI + 0x680);
      in_stack_fffffffffffffcd0 = local_258;
      if (local_258 != (vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)0x0) {
        operator_delete__(local_258);
      }
      std::__cxx11::string::operator=((string *)(in_RDI + 0x660),local_18);
      std::ifstream::close();
      local_238 = 0;
    }
    std::ifstream::~ifstream(local_228);
    if (local_238 != 0) goto LAB_001b440b;
  }
  local_260 = 0;
  local_268 = std::__cxx11::string::find((char *)(in_RDI + 0x680),0x1e61e7);
  local_270 = std::__cxx11::string::find((char *)(in_RDI + 0x680),0x1d8c2a);
  local_278 = local_268;
  if ((local_270 != 0xffffffffffffffff) && (local_270 < local_268)) {
    if (local_270 == 0) {
      local_278 = 0xffffffffffffffff;
    }
    else {
      local_278 = local_270 - 1;
    }
  }
  if ((local_278 == 0xffffffffffffffff) && (local_270 != 0xffffffffffffffff)) {
    if (local_270 == 0) {
      local_278 = 0xffffffffffffffff;
    }
    else {
      local_278 = local_270 - 1;
    }
  }
  while (uVar6 = local_278 != 0xffffffffffffffff && local_260 < local_278,
        local_278 != 0xffffffffffffffff && local_260 < local_278) {
    std::__cxx11::string::substr((ulong)local_298,in_RDI + 0x680);
    local_260 = local_278 + 1;
    local_268 = std::__cxx11::string::find((char *)(in_RDI + 0x680),0x1e61e7);
    local_270 = std::__cxx11::string::find((char *)(in_RDI + 0x680),0x1d8c2a);
    local_278 = local_268;
    if ((local_270 != 0xffffffffffffffff) && (local_270 < local_268)) {
      if (local_270 == 0) {
        local_278 = 0xffffffffffffffff;
      }
      else {
        local_278 = local_270 - 1;
      }
    }
    if ((local_278 == 0xffffffffffffffff) && (local_270 != 0xffffffffffffffff)) {
      if (local_270 == 0) {
        local_278 = 0xffffffffffffffff;
      }
      else {
        local_278 = local_270 - 1;
      }
    }
    uVar5 = std::__cxx11::string::length();
    if (uVar5 < 2) {
      local_238 = 2;
    }
    else {
      local_2a0 = std::__cxx11::string::find((string *)(in_RDI + 0x518),(ulong)local_298);
      while (local_2a0 != -1) {
        ErrorStruct::ErrorStruct((ErrorStruct *)0x1b42f4);
        GetLineNumber(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                      SUB81((ulong)in_stack_fffffffffffffcd8 >> 0x38,0));
        std::__cxx11::string::operator=(local_2c0,"The word is in the black list");
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (in_stack_fffffffffffffcd0,(value_type *)CONCAT17(uVar6,in_stack_fffffffffffffcc8)
                  );
        local_19 = 1;
        local_2a0 = std::__cxx11::string::find((string *)(in_RDI + 0x518),(ulong)local_298);
        ErrorStruct::~ErrorStruct((ErrorStruct *)0x1b4398);
      }
      local_238 = 0;
    }
    std::__cxx11::string::~string(local_298);
  }
  local_1 = (local_19 ^ 0xff) & 1;
LAB_001b440b:
  return (bool)(local_1 & 1);
}

Assistant:

bool Parser::CheckBlackList(const char* filename)
{
  m_TestsDone[BLACKLIST] = true;
  m_TestsDescription[BLACKLIST] = "No word should match any words from the file: ";
  m_TestsDescription[BLACKLIST] += filename;

  bool hasError = false;

  // If the black list is not read we read it
  if(strcmp(m_BlackList.c_str(),filename))
    {
    // Read the file
    std::ifstream file;
    file.open(filename, std::ios::binary | std::ios::in);
    if(!file.is_open())
      {
      std::cout << "Cannot open file: " << filename << std::endl;
      return false;
      }
    file.seekg(0,std::ios::end);
    unsigned long fileSize = file.tellg();
    file.seekg(0,std::ios::beg);

    char* buf = new char[fileSize+1];
    file.read(buf,fileSize);
    buf[fileSize] = 0; 
    m_BlackListBuffer = buf;
    m_BlackListBuffer.resize(fileSize);
    delete [] buf;
    m_BlackList = filename;
    file.close();
    }

  // Go through the list of words
  size_t start = 0;
  size_t space = m_BlackListBuffer.find(" ",start);
  size_t eol = m_BlackListBuffer.find("\n",start);

  size_t end = space;
  if(eol != std::string::npos && eol < space)
    {
    if(eol == 0)
      {
      end = std::string::npos;
      }
    else
      {
      end = eol-1;
      }
    }

  if(end == std::string::npos && eol != std::string::npos)
    {
    if(eol == 0)
      {
      end = std::string::npos;
      }
    else
      {
      end = eol-1;
      }
    }

  while(end != std::string::npos && end>start)
    {
    std::string blackword = m_BlackListBuffer.substr(start,end-start);
    start = end+1;
    
    space = m_BlackListBuffer.find(" ",start);
    eol = m_BlackListBuffer.find("\n",start);

    end = space;
    if(eol != std::string::npos && eol < space)
      {
      if(eol == 0)
        {
        end = std::string::npos;
        }
      else
        {
        end = eol-1;
        }
      }
    if(end == std::string::npos && eol != std::string::npos)
      {
      if(eol == 0)
        {
        end = std::string::npos;
        }
      else
        {
        end = eol-1;
        }
      }

    if(blackword.length() <= 1)
      {
      continue;
      }

    size_t pos = m_BufferNoComment.find(blackword,0);
    while(pos != std::string::npos)
      {
      Error error;
      error.line = this->GetLineNumber(pos,true);
      error.line2 = error.line;
      error.number = BLACKLIST;
      error.description = "The word is in the black list";
      m_ErrorList.push_back(error);
      hasError = true;
      pos = m_BufferNoComment.find(blackword,pos+1);
      }
    }
  return !hasError;
}